

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void leaks_with_empty(_Bool copy_on_write)

{
  roaring_bitmap_t *prVar1;
  roaring_bitmap_t *r2;
  roaring_bitmap_t *r;
  roaring_bitmap_t *file;
  undefined1 in_DIL;
  roaring_bitmap_t *unaff_retaddr;
  roaring_bitmap_t *randnot;
  roaring_bitmap_t *rand;
  roaring_bitmap_t *rxor;
  roaring_bitmap_t *ror;
  uint32_t i;
  roaring_bitmap_t *r1;
  roaring_bitmap_t *empty;
  roaring_bitmap_t *in_stack_00000050;
  roaring_bitmap_t *in_stack_00000058;
  int in_stack_ffffffffffffffbc;
  undefined4 local_1c;
  undefined3 in_stack_fffffffffffffffc;
  uint32_t val;
  
  val = CONCAT13(in_DIL,in_stack_fffffffffffffffc) & 0x1ffffff;
  prVar1 = roaring_bitmap_create();
  roaring_bitmap_set_copy_on_write(prVar1,(_Bool)((byte)(val >> 0x18) & 1));
  prVar1 = roaring_bitmap_create();
  roaring_bitmap_set_copy_on_write(prVar1,(_Bool)((byte)(val >> 0x18) & 1));
  for (local_1c = 100; local_1c < 70000; local_1c = local_1c + 3) {
    roaring_bitmap_add(unaff_retaddr,val);
  }
  prVar1 = roaring_bitmap_or(in_stack_00000058,in_stack_00000050);
  r2 = roaring_bitmap_xor(in_stack_00000058,in_stack_00000050);
  r = roaring_bitmap_and(rand,randnot);
  file = roaring_bitmap_andnot(in_stack_00000058,in_stack_00000050);
  roaring_bitmap_free((roaring_bitmap_t *)0x10423e);
  roaring_bitmap_equals(prVar1,r2);
  _assert_true((unsigned_long)r2,(char *)r,(char *)file,in_stack_ffffffffffffffbc);
  roaring_bitmap_free((roaring_bitmap_t *)0x104276);
  roaring_bitmap_equals(prVar1,r2);
  _assert_true((unsigned_long)r2,(char *)r,(char *)file,in_stack_ffffffffffffffbc);
  roaring_bitmap_free((roaring_bitmap_t *)0x1042ae);
  roaring_bitmap_equals(prVar1,r2);
  _assert_true((unsigned_long)r2,(char *)r,(char *)file,in_stack_ffffffffffffffbc);
  roaring_bitmap_free((roaring_bitmap_t *)0x1042e6);
  roaring_bitmap_free((roaring_bitmap_t *)0x1042f0);
  roaring_bitmap_is_empty(r);
  _assert_true((unsigned_long)r2,(char *)r,(char *)file,in_stack_ffffffffffffffbc);
  roaring_bitmap_free((roaring_bitmap_t *)0x104323);
  return;
}

Assistant:

void leaks_with_empty(bool copy_on_write) {
    roaring_bitmap_t *empty = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(empty, copy_on_write);
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r1, copy_on_write);
    for (uint32_t i = 100; i < 70000; i += 3) {
        roaring_bitmap_add(r1, i);
    }
    roaring_bitmap_t *ror = roaring_bitmap_or(r1, empty);
    roaring_bitmap_t *rxor = roaring_bitmap_xor(r1, empty);
    roaring_bitmap_t *rand = roaring_bitmap_and(r1, empty);
    roaring_bitmap_t *randnot = roaring_bitmap_andnot(r1, empty);
    roaring_bitmap_free(empty);
    assert_true(roaring_bitmap_equals(ror, r1));
    roaring_bitmap_free(ror);
    assert_true(roaring_bitmap_equals(rxor, r1));
    roaring_bitmap_free(rxor);
    assert_true(roaring_bitmap_equals(randnot, r1));
    roaring_bitmap_free(randnot);
    roaring_bitmap_free(r1);
    assert_true(roaring_bitmap_is_empty(rand));
    roaring_bitmap_free(rand);
}